

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void __thiscall
crnlib::vector<crnlib::vec<3U,_int>_>::reserve
          (vector<crnlib::vec<3U,_int>_> *this,uint new_capacity)

{
  vec<3U,_int> *pvVar1;
  undefined8 uVar2;
  vector<crnlib::vec<3U,_int>_> local_18;
  
  if (this->m_capacity < new_capacity) {
    increase_capacity(this,new_capacity,false,false);
    return;
  }
  if (new_capacity < this->m_capacity) {
    local_18.m_p = (vec<3U,_int> *)0x0;
    local_18.m_size = 0;
    local_18.m_capacity = 0;
    if (new_capacity < this->m_size) {
      new_capacity = this->m_size;
    }
    increase_capacity(&local_18,new_capacity,false,false);
    operator=(&local_18,this);
    pvVar1 = this->m_p;
    this->m_p = local_18.m_p;
    uVar2._0_4_ = this->m_size;
    uVar2._4_4_ = this->m_capacity;
    this->m_size = local_18.m_size;
    this->m_capacity = local_18.m_capacity;
    local_18.m_p = pvVar1;
    local_18._8_8_ = uVar2;
    ~vector(&local_18);
  }
  return;
}

Assistant:

inline void reserve(uint new_capacity)
        {
            if (new_capacity > m_capacity)
            {
                increase_capacity(new_capacity, false);
            }
            else if (new_capacity < m_capacity)
            {
                // Must work around the lack of a "decrease_capacity()" method.
                // This case is rare enough in practice that it's probably not worth implementing an optimized in-place resize.
                vector tmp;
                tmp.increase_capacity(math::maximum(m_size, new_capacity), false);
                tmp = *this;
                swap(tmp);
            }
        }